

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

void class_destroy(klass cls)

{
  atomic_uintmax_t aVar1;
  class_impl_interface_destroy p_Var2;
  long lVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  
  if (cls == (klass)0x0) {
    return;
  }
  aVar1 = (cls->ref).count;
  if (aVar1 != 0) {
    LOCK();
    (cls->ref).count = (cls->ref).count - 1;
    UNLOCK();
    LOCK();
    class_stats.decrements = class_stats.decrements + 1;
    UNLOCK();
    if (aVar1 != 0) goto LAB_001081d0;
  }
  pcVar5 = "<anonymous>";
  if (cls->name != (char *)0x0) {
    pcVar5 = cls->name;
  }
  log_write_impl_va("metacall",0x34b,"class_destroy",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                    ,3,"Invalid reference counter in class: %s",pcVar5);
LAB_001081d0:
  if ((cls->ref).count == 0) {
    lVar3 = vector_size(cls->constructors);
    if (lVar3 != 0) {
      lVar6 = 0;
      do {
        puVar4 = (undefined8 *)vector_at(cls->constructors,lVar6);
        constructor_destroy((constructor)*puVar4);
        lVar6 = lVar6 + 1;
      } while (lVar3 != lVar6);
    }
    set_iterate(cls->attributes,class_attributes_destroy_cb_iterate,0);
    set_iterate(cls->static_attributes,class_attributes_destroy_cb_iterate,0);
    map_iterate(cls->methods,class_methods_destroy_cb_iterate,0);
    map_iterate(cls->static_methods,class_methods_destroy_cb_iterate,0);
    if ((cls->interface != (class_interface)0x0) &&
       (p_Var2 = cls->interface->destroy, p_Var2 != (class_impl_interface_destroy)0x0)) {
      (*p_Var2)(cls,cls->impl);
    }
    if (cls->name != (char *)0x0) {
      free(cls->name);
    }
    if (cls->constructors != (vector)0x0) {
      vector_destroy();
    }
    if (cls->methods != (map)0x0) {
      map_destroy();
    }
    if (cls->static_methods != (map)0x0) {
      map_destroy();
    }
    if (cls->attributes != (set)0x0) {
      set_destroy();
    }
    if (cls->static_attributes != (set)0x0) {
      set_destroy();
    }
    free(cls);
    LOCK();
    class_stats.deallocations = class_stats.deallocations + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void class_destroy(klass cls)
{
	if (cls != NULL)
	{
		if (class_decrement_reference(cls) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in class: %s", cls->name ? cls->name : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&cls->ref) == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (cls->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous class <%p>", (void *)cls);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy class %s <%p>", cls->name, (void *)cls);
			}
			*/

			class_constructors_destroy(cls);

			set_iterate(cls->attributes, &class_attributes_destroy_cb_iterate, NULL);
			set_iterate(cls->static_attributes, &class_attributes_destroy_cb_iterate, NULL);

			map_iterate(cls->methods, &class_methods_destroy_cb_iterate, NULL);
			map_iterate(cls->static_methods, &class_methods_destroy_cb_iterate, NULL);

			if (cls->interface != NULL && cls->interface->destroy != NULL)
			{
				cls->interface->destroy(cls, cls->impl);
			}

			if (cls->name != NULL)
			{
				free(cls->name);
			}

			if (cls->constructors != NULL)
			{
				vector_destroy(cls->constructors);
			}

			if (cls->methods != NULL)
			{
				map_destroy(cls->methods);
			}

			if (cls->static_methods != NULL)
			{
				map_destroy(cls->static_methods);
			}

			if (cls->attributes != NULL)
			{
				set_destroy(cls->attributes);
			}

			if (cls->static_attributes != NULL)
			{
				set_destroy(cls->static_attributes);
			}

			threading_atomic_ref_count_destroy(&cls->ref);

			free(cls);

			reflect_memory_tracker_deallocation(class_stats);
		}
	}
}